

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_0::render(Functions *gl,deUint32 program,Vec4 *color)

{
  GLuint GVar1;
  GLenum GVar2;
  GLint GVar3;
  float positions [12];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0x3f800000bf800000;
  uStack_40 = 0xbf800000bf800000;
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0x3f8000003f800000;
  local_68 = 0xbf800000bf800000;
  uStack_60 = 0xbf8000003f800000;
  (*gl->useProgram)(program);
  GVar1 = (*gl->getAttribLocation)(program,"a_pos");
  (*gl->enableVertexAttribArray)(GVar1);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Failed to setup shader program for rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                  ,0xee);
  GVar3 = (*gl->getUniformLocation)(program,"u_color");
  (*gl->uniform4fv)(GVar3,1,color->m_data);
  (*gl->vertexAttribPointer)(GVar1,2,0x1406,'\0',0,&local_68);
  (*gl->drawArrays)(4,0,6);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                  ,0xf5);
  return;
}

Assistant:

void render (const glw::Functions& gl, deUint32 program, const tcu::Vec4& color)
{
	const float positions[] =
	{
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,  1.0f,

		 1.0f,  1.0f,
		-1.0f,  1.0f,
		-1.0f, -1.0f
	};

	deUint32 posLocation;
	deUint32 colorLocation;

	gl.useProgram(program);
	posLocation	= gl.getAttribLocation(program, "a_pos");
	gl.enableVertexAttribArray(posLocation);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup shader program for rendering");

	colorLocation = gl.getUniformLocation(program, "u_color");
	gl.uniform4fv(colorLocation, 1, color.getPtr());

	gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions);
	gl.drawArrays(GL_TRIANGLES, 0, 6);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");
}